

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O3

Inversion * __thiscall
OpenMD::MoleculeCreator::createInversion
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,InversionStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  pointer ppAVar1;
  Atom *atom1;
  Atom *atom2;
  pointer pcVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  int iVar6;
  InversionType *it;
  Inversion *this_00;
  long *plVar7;
  uint uVar8;
  size_type *psVar10;
  string s;
  vector<int,_std::allocator<int>_> satellites;
  InversionTypeParser itParser;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  Atom *local_a0;
  Atom *local_98;
  vector<int,_std::allocator<int>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
  local_60;
  Atom *pAVar9;
  
  InversionTypeParser::InversionTypeParser((InversionTypeParser *)&local_60);
  uVar8 = stamp->center_;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,&stamp->satellites_);
  if ((long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0xc) {
    this_00 = (Inversion *)0x0;
    goto LAB_0016cccc;
  }
  ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  atom1 = ppAVar1[uVar8];
  atom2 = ppAVar1[(uint)*local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start];
  local_98 = ppAVar1[(uint)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[1]];
  local_a0 = ppAVar1[(uint)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[2]];
  if (stamp->hasOverride_ == true) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    pcVar2 = (stamp->orType_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar2,pcVar2 + (stamp->orType_)._M_string_length);
    std::vector<double,_std::allocator<double>_>::vector(&local_78,&stamp->orPars_);
    it = InversionTypeParser::parseTypeAndPars
                   ((InversionTypeParser *)&local_60,&local_120,&local_78);
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (it == (InversionType *)0x0) {
LAB_0016ccc1:
      this_00 = (Inversion *)0x0;
      goto LAB_0016cccc;
    }
  }
  else {
    (*(atom1->super_StuntDouble)._vptr_StuntDouble[7])(&local_120,atom1);
    (*(atom2->super_StuntDouble)._vptr_StuntDouble[7])(&local_e0,atom2);
    (*(local_98->super_StuntDouble)._vptr_StuntDouble[7])(&local_100);
    (*(local_a0->super_StuntDouble)._vptr_StuntDouble[7])(&local_c0);
    it = ForceField::getInversionType(ff,&local_120,&local_e0,&local_100,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (it == (InversionType *)0x0) {
      (*(atom1->super_StuntDouble)._vptr_StuntDouble[7])(&local_120,atom1);
      _Var3._M_p = local_120._M_dataplus._M_p;
      (*(atom2->super_StuntDouble)._vptr_StuntDouble[7])(&local_e0,atom2);
      _Var5._M_p = local_e0._M_dataplus._M_p;
      (*(local_98->super_StuntDouble)._vptr_StuntDouble[7])(&local_100);
      _Var4._M_p = local_100._M_dataplus._M_p;
      (*(local_a0->super_StuntDouble)._vptr_StuntDouble[7])(&local_c0);
      snprintf(painCave.errMsg,2000,
               "No Matching Inversion Type for[%s, %s, %s, %s]\n\t(May not be a problem: not all inversions are parametrized)\n"
               ,_Var3._M_p,_Var5._M_p,_Var4._M_p,local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 0;
      painCave.severity = 3;
      simError();
      goto LAB_0016ccc1;
    }
  }
  this_00 = (Inversion *)operator_new(0xa0);
  pAVar9 = local_98;
  Inversion::Inversion(this_00,atom1,atom2,local_98,local_a0,it);
  uVar8 = (uint)pAVar9;
  iVar6 = IndexListContainer::pop(&localIndexMan->inversionIndexContainer_);
  (this_00->super_ShortRangeInteraction).localIndex_ = iVar6;
  OpenMD_itoa_abi_cxx11_
            (&local_120,
             (OpenMD *)
             ((ulong)((long)(mol->inversions_).
                            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(mol->inversions_).
                           super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3),10,uVar8);
  pcVar2 = (mol->molStamp_->Name).data_._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + (mol->molStamp_->Name).data_._M_string_length);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_100.field_2._M_allocated_capacity = *psVar10;
    local_100.field_2._8_8_ = plVar7[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar10;
    local_100._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_100._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_e0.field_2._M_allocated_capacity = *psVar10;
    local_e0.field_2._8_4_ = (undefined4)plVar7[3];
    local_e0.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar10;
    local_e0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_e0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (*(this_00->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
LAB_0016cccc:
  if ((uint *)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (uint *)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
  ::~_Rb_tree(&local_60);
  return this_00;
}

Assistant:

Inversion* MoleculeCreator::createInversion(
      ForceField* ff, Molecule* mol, InversionStamp* stamp,
      LocalIndexManager* localIndexMan) {
    InversionTypeParser itParser;
    InversionType* inversionType = NULL;
    Inversion* inversion         = NULL;

    int center                  = stamp->getCenter();
    std::vector<int> satellites = stamp->getSatellites();
    if (satellites.size() != 3) { return inversion; }

    Atom* atomA = mol->getAtomAt(center);
    Atom* atomB = mol->getAtomAt(satellites[0]);
    Atom* atomC = mol->getAtomAt(satellites[1]);
    Atom* atomD = mol->getAtomAt(satellites[2]);

    assert(atomA && atomB && atomC && atomD);

    if (stamp->hasOverride()) {
      try {
        inversionType = itParser.parseTypeAndPars(stamp->getOverrideType(),
                                                  stamp->getOverridePars());
      } catch (OpenMDException& e) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MoleculeCreator Error: %s "
                 "for molecule %s\n",
                 e.what(), mol->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }
    } else {
      inversionType = ff->getInversionType(atomA->getType(), atomB->getType(),
                                           atomC->getType(), atomD->getType());

      if (inversionType == NULL) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "No Matching Inversion Type for[%s, %s, %s, %s]\n"
            "\t(May not be a problem: not all inversions are parametrized)\n",
            atomA->getType().c_str(), atomB->getType().c_str(),
            atomC->getType().c_str(), atomD->getType().c_str());

        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
      }
    }
    if (inversionType != NULL) {
      inversion = new Inversion(atomA, atomB, atomC, atomD, inversionType);

      // set the local index of this inversion, the global index will
      // be set later
      inversion->setLocalIndex(localIndexMan->getNextInversionIndex());

      // The rule for naming an inversion is: MoleculeName_Inversion_Integer
      // The first part is the name of the molecule
      // The second part is always fixed as "Inversion"
      // The third part is the index of the inversion defined in meta-data file
      // For example, Benzene_Inversion_0 is a valid Inversion name in a
      // Benzene molecule

      std::string s = OpenMD_itoa(mol->getNInversions(), 10);
      inversion->setName(mol->getType() + "_Inversion_" + s.c_str());
      return inversion;
    } else {
      return NULL;
    }
  }